

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemorySize
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name memory)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  undefined1 local_28 [8];
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  local_28 = memory.super_IString.str._M_len;
  p_Var2 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->memorySizes)._M_h,
                      memory_local.super_IString.str._M_len %
                      (this->memorySizes)._M_h._M_bucket_count,(key_type *)local_28,
                      memory_local.super_IString.str._M_len);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getMemorySize called on non-existing memory");
  }
  return (Address)(address64_t)p_Var2[3]._M_nxt;
}

Assistant:

Address getMemorySize(Name memory) {
    auto iter = memorySizes.find(memory);
    if (iter == memorySizes.end()) {
      externalInterface->trap("getMemorySize called on non-existing memory");
    }
    return iter->second;
  }